

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_greaterp(LispPTR tosm1,LispPTR tos)

{
  LispPTR *pLVar1;
  uint local_1c;
  uint local_18;
  int arg2;
  int arg1;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if ((tosm1 & 0xfff0000) == 0xe0000) {
    local_18 = tosm1 & 0xffff;
LAB_00108953:
    if ((tos & 0xfff0000) == 0xe0000) {
      local_1c = tos & 0xffff;
    }
    else if ((tos & 0xfff0000) == 0xf0000) {
      local_1c = tos | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_001089e5;
      pLVar1 = NativeAligned4FromLAddr(tos);
      local_1c = *pLVar1;
    }
    if ((int)local_1c < (int)local_18) {
      tos_local = 0x4c;
    }
    else {
      tos_local = 0;
    }
  }
  else {
    if ((tosm1 & 0xfff0000) == 0xf0000) {
      local_18 = tosm1 | 0xffff0000;
      goto LAB_00108953;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (tosm1 >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar1 = NativeAligned4FromLAddr(tosm1);
      local_18 = *pLVar1;
      goto LAB_00108953;
    }
LAB_001089e5:
    tos_local = N_OP_fgreaterp(tosm1,tos);
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_greaterp(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;

  N_GETNUMBER(tosm1, arg1, do_ufn);
  N_GETNUMBER(tos, arg2, do_ufn);

  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);

do_ufn:
  return (N_OP_fgreaterp(tosm1, tos));
}